

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void createstdfile(lua_State *L,FILE *f,int k,char *fname)

{
  StkId pTVar1;
  FILE **ppFVar2;
  int idx;
  FILE *pFVar3;
  
  pFVar3 = f;
  ppFVar2 = newfile(L);
  idx = (int)pFVar3;
  *ppFVar2 = f;
  if (0 < k) {
    pTVar1 = L->top;
    pTVar1->value = pTVar1[-1].value;
    pTVar1->tt = pTVar1[-1].tt;
    L->top = L->top + 1;
    idx = -0x2711;
    lua_rawseti(L,-0x2711,k);
  }
  pTVar1 = L->top;
  pTVar1->value = pTVar1[-2].value;
  pTVar1->tt = pTVar1[-2].tt;
  L->top = L->top + 1;
  lua_setfenv(L,idx);
  lua_setfield(L,-3,fname);
  return;
}

Assistant:

static void createstdfile(lua_State*L,FILE*f,int k,const char*fname){
*newfile(L)=f;
if(k>0){
lua_pushvalue(L,-1);
lua_rawseti(L,(-10001),k);
}
lua_pushvalue(L,-2);
lua_setfenv(L,-2);
lua_setfield(L,-3,fname);
}